

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O2

unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
 __thiscall
prometheus::detail::
make_unique<prometheus::Family<prometheus::Counter>,char_const(&)[15],char_const(&)[20],std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (detail *this,char (*args) [15],char (*args_1) [20],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args_2)

{
  Family<prometheus::Counter> *this_00;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = (Family<prometheus::Counter> *)operator_new(0xd8);
  std::__cxx11::string::string((string *)&local_48,*args,&local_69);
  std::__cxx11::string::string((string *)&local_68,*args_1,&local_6a);
  Family<prometheus::Counter>::Family(this_00,&local_48,&local_68,args_2);
  *(Family<prometheus::Counter> **)this = this_00;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return (__uniq_ptr_data<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>,_true,_true>
          )(__uniq_ptr_data<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}